

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O3

void __thiscall DPSprite::DPSprite(DPSprite *this,player_t *owner,AActor *caller,int id)

{
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DPSprite *pDVar4;
  DPSprite *pointing;
  AActor *pAVar5;
  anon_union_8_2_947301c2_for_TObjPtr<DPSprite>_1 *paVar6;
  bool bVar7;
  PClass *pPVar3;
  
  DObject::DObject(&this->super_DObject);
  (this->super_DObject)._vptr_DObject = (_func_int **)&PTR_StaticType_006fc7e8;
  this->x = 0.0;
  this->y = 0.0;
  this->oldx = 0.0;
  this->oldy = 0.0;
  this->firstTic = true;
  pointing = (DPSprite *)0x0;
  this->Flags = 0;
  (this->Caller).field_0.p = caller;
  this->Owner = owner;
  this->Sprite = 0;
  this->ID = id;
  this->processPending = true;
  pDVar4 = (owner->psprites).field_0.p;
  if (pDVar4 == (DPSprite *)0x0) {
LAB_00438679:
    (this->Next).field_0.p = (DPSprite *)0x0;
  }
  else {
    if (((pDVar4->super_DObject).ObjectFlags & 0x20) != 0) {
      paVar6 = &(owner->psprites).field_0;
      pointing = (DPSprite *)0x0;
LAB_00438672:
      paVar6->p = (DPSprite *)0x0;
      goto LAB_00438679;
    }
    if (pDVar4->ID < id) {
      do {
        pointing = pDVar4;
        pDVar4 = (pointing->Next).field_0.p;
        if (pDVar4 == (DPSprite *)0x0) goto LAB_00438679;
        if (((pDVar4->super_DObject).ObjectFlags & 0x20) != 0) {
          paVar6 = &(pointing->Next).field_0;
          goto LAB_00438672;
        }
      } while (pDVar4->ID < id);
    }
    else {
      pointing = (DPSprite *)0x0;
    }
    (this->Next).field_0.p = pDVar4;
    if ((((pDVar4->super_DObject).ObjectFlags & 3) != 0) &&
       (((this->super_DObject).ObjectFlags & 4) != 0)) {
      GC::Barrier(&this->super_DObject,&pDVar4->super_DObject);
    }
  }
  if (pointing == (DPSprite *)0x0) {
    (this->Owner->psprites).field_0.p = this;
    if ((GC::State == 1) && (((this->super_DObject).ObjectFlags & 3) != 0)) {
      GC::Barrier((DObject *)0x0,&this->super_DObject);
    }
  }
  else {
    (pointing->Next).field_0.p = this;
    if ((((this->super_DObject).ObjectFlags & 3) != 0) &&
       (((pointing->super_DObject).ObjectFlags & 4) != 0)) {
      GC::Barrier(&pointing->super_DObject,&this->super_DObject);
    }
  }
  pDVar4 = (this->Next).field_0.p;
  if (pDVar4 != (DPSprite *)0x0) {
    if (((pDVar4->super_DObject).ObjectFlags & 0x20) == 0) {
      if (this->ID != 0 && pDVar4->ID == this->ID) {
        (*(pDVar4->super_DObject)._vptr_DObject[4])();
      }
    }
    else {
      (this->Next).field_0.p = (DPSprite *)0x0;
    }
  }
  pAVar5 = (this->Caller).field_0.p;
  if (pAVar5 == (AActor *)0x0) {
LAB_0043871a:
    pAVar5 = (AActor *)0x0;
  }
  else if (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (this->Caller).field_0.p = (AActor *)0x0;
    goto LAB_0043871a;
  }
  pPVar1 = AWeapon::RegistrationInfo.MyClass;
  pPVar3 = (pAVar5->super_DThinker).super_DObject.Class;
  if (pPVar3 == (PClass *)0x0) {
    iVar2 = (**(pAVar5->super_DThinker).super_DObject._vptr_DObject)(pAVar5);
    pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
    (pAVar5->super_DThinker).super_DObject.Class = pPVar3;
  }
  bVar7 = pPVar3 != (PClass *)0x0;
  if (pPVar3 != pPVar1 && bVar7) {
    do {
      pPVar3 = pPVar3->ParentClass;
      bVar7 = pPVar3 != (PClass *)0x0;
      if (pPVar3 == pPVar1) break;
    } while (pPVar3 != (PClass *)0x0);
  }
  if (bVar7) goto LAB_004387d6;
  pAVar5 = (this->Caller).field_0.p;
  if (pAVar5 == (AActor *)0x0) {
LAB_00438784:
    pAVar5 = (AActor *)0x0;
  }
  else if (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (this->Caller).field_0.p = (AActor *)0x0;
    goto LAB_00438784;
  }
  pPVar1 = APlayerPawn::RegistrationInfo.MyClass;
  pPVar3 = (pAVar5->super_DThinker).super_DObject.Class;
  if (pPVar3 == (PClass *)0x0) {
    iVar2 = (**(pAVar5->super_DThinker).super_DObject._vptr_DObject)(pAVar5);
    pPVar3 = (PClass *)CONCAT44(extraout_var_00,iVar2);
    (pAVar5->super_DThinker).super_DObject.Class = pPVar3;
  }
  bVar7 = pPVar3 != (PClass *)0x0;
  if (pPVar3 != pPVar1 && bVar7) {
    do {
      pPVar3 = pPVar3->ParentClass;
      bVar7 = pPVar3 != (PClass *)0x0;
      if (pPVar3 == pPVar1) break;
    } while (pPVar3 != (PClass *)0x0);
  }
  if (!bVar7) {
    return;
  }
LAB_004387d6:
  this->Flags = 0xf;
  return;
}

Assistant:

DPSprite::DPSprite(player_t *owner, AActor *caller, int id)
: x(.0), y(.0),
  oldx(.0), oldy(.0),
  firstTic(true),
  Sprite(0),
  Flags(0),
  Caller(caller),
  Owner(owner),
  ID(id),
  processPending(true)
{
	DPSprite *prev = nullptr;
	DPSprite *next = Owner->psprites;
	while (next != nullptr && next->ID < ID)
	{
		prev = next;
		next = next->Next;
	}
	Next = next;
	GC::WriteBarrier(this, next);
	if (prev == nullptr)
	{
		Owner->psprites = this;
		GC::WriteBarrier(this);
	}
	else
	{
		prev->Next = this;
		GC::WriteBarrier(prev, this);
	}

	if (Next && Next->ID == ID && ID != 0)
		Next->Destroy(); // Replace it.

	if (Caller->IsKindOf(RUNTIME_CLASS(AWeapon)) || Caller->IsKindOf(RUNTIME_CLASS(APlayerPawn)))
		Flags = (PSPF_ADDWEAPON|PSPF_ADDBOB|PSPF_POWDOUBLE|PSPF_CVARFAST);
}